

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-util.c
# Opt level: O1

void monster_swap(loc grid1,loc grid2)

{
  uint32_t *puVar1;
  short sVar2;
  short sVar3;
  loc grid1_00;
  loc grid2_00;
  loc grid2_01;
  player_upkeep *ppVar4;
  player *ppVar5;
  _Bool _Var6;
  monster_conflict *pmVar7;
  wchar_t wVar8;
  wchar_t wVar9;
  
  grid1_00.x = (player->grid).x;
  grid1_00.y = (player->grid).y;
  wVar9 = grid1.x;
  sVar2 = cave->squares[(long)grid1 >> 0x20][wVar9].mon;
  wVar8 = grid2.x;
  sVar3 = cave->squares[(long)grid2 >> 0x20][wVar8].mon;
  square_set_mon(cave,grid1,(int)sVar3);
  square_set_mon(cave,grid2,(int)sVar2);
  ppVar5 = player;
  if (sVar2 < 1) {
    if (sVar2 < 0) {
      (player->grid).x = wVar8;
      (ppVar5->grid).y = grid2.y;
      grid2_00.x = (ppVar5->grid).x;
      grid2_00.y = (ppVar5->grid).y;
      player_leaving(grid1_00,grid2_00);
      ppVar4 = player->upkeep;
      puVar1 = &ppVar4->update;
      *puVar1 = *puVar1 | 0x1a0;
      puVar1 = &ppVar4->redraw;
      *puVar1 = *puVar1 | 0x404000;
      cmd_disable_repeat_floor_item();
    }
  }
  else {
    pmVar7 = (monster_conflict *)cave_monster(cave,(int)sVar2);
    _Var6 = monster_is_camouflaged((monster *)pmVar7);
    if (_Var6) {
      _Var6 = monster_is_in_view((monster *)pmVar7);
      if (_Var6) {
LAB_001798dd:
        become_aware((chunk *)cave,pmVar7);
      }
      else {
        if (-1 < sVar3) {
          _Var6 = los(cave,(loc_conflict)grid1_00,(loc_conflict)grid2);
          if (_Var6) goto LAB_001798dd;
        }
        if (sVar3 < 0) {
          _Var6 = los(cave,(loc_conflict)grid1,(loc_conflict)grid2);
          if (_Var6) goto LAB_001798dd;
        }
        _Var6 = monster_is_mimicking((monster *)pmVar7);
        if (_Var6) {
          move_mimicked_object((chunk *)cave,pmVar7,grid1,grid2);
          puVar1 = &player->upkeep->redraw;
          *puVar1 = *puVar1 | 0x800000;
        }
      }
    }
    (pmVar7->grid).x = wVar8;
    (pmVar7->grid).y = grid2.y;
    update_mon(pmVar7,(chunk *)cave,true);
    if (pmVar7->race->light != L'\0') {
      puVar1 = &player->upkeep->update;
      *puVar1 = *puVar1 | 0x60;
    }
    puVar1 = &player->upkeep->redraw;
    *puVar1 = *puVar1 | 0x400000;
  }
  ppVar5 = player;
  if (sVar3 < 1) {
    if (sVar3 < 0) {
      (player->grid).x = wVar9;
      (ppVar5->grid).y = grid1.y;
      grid2_01.x = (ppVar5->grid).x;
      grid2_01.y = (ppVar5->grid).y;
      player_leaving(grid1_00,grid2_01);
      ppVar4 = player->upkeep;
      puVar1 = &ppVar4->update;
      *puVar1 = *puVar1 | 0x1a0;
      puVar1 = &ppVar4->redraw;
      *puVar1 = *puVar1 | 0x404000;
      cmd_disable_repeat_floor_item();
    }
    goto LAB_00179a9d;
  }
  pmVar7 = (monster_conflict *)cave_monster(cave,(int)sVar3);
  _Var6 = monster_is_camouflaged((monster *)pmVar7);
  if (_Var6) {
    _Var6 = monster_is_in_view((monster *)pmVar7);
    if (_Var6) {
LAB_001799fe:
      become_aware((chunk *)cave,pmVar7);
    }
    else {
      if (-1 < sVar2) {
        _Var6 = los(cave,(loc_conflict)grid1_00,(loc_conflict)grid1);
        if (_Var6) goto LAB_001799fe;
      }
      if (sVar2 < 0) {
        _Var6 = los(cave,(loc_conflict)grid2,(loc_conflict)grid1);
        if (_Var6) goto LAB_001799fe;
      }
      _Var6 = monster_is_mimicking((monster *)pmVar7);
      if (_Var6) {
        move_mimicked_object((chunk *)cave,pmVar7,grid2,grid1);
        puVar1 = &player->upkeep->redraw;
        *puVar1 = *puVar1 | 0x800000;
      }
    }
  }
  (pmVar7->grid).x = wVar9;
  (pmVar7->grid).y = grid1.y;
  update_mon(pmVar7,(chunk *)cave,true);
  if (pmVar7->race->light != L'\0') {
    puVar1 = &player->upkeep->update;
    *puVar1 = *puVar1 | 0x60;
  }
  puVar1 = &player->upkeep->redraw;
  *puVar1 = *puVar1 | 0x400000;
LAB_00179a9d:
  square_light_spot((chunk *)cave,grid1);
  square_light_spot((chunk *)cave,grid2);
  return;
}

Assistant:

void monster_swap(struct loc grid1, struct loc grid2)
{
	int m1, m2;
	struct monster *mon;
	struct loc pgrid = player->grid;

	/* Monsters */
	m1 = cave->squares[grid1.y][grid1.x].mon;
	m2 = cave->squares[grid2.y][grid2.x].mon;

	/* Update grids */
	square_set_mon(cave, grid1, m2);
	square_set_mon(cave, grid2, m1);

	/* Monster 1 */
	if (m1 > 0) {
		/* Monster */
		mon = cave_monster(cave, m1);

		/* Update monster */
		if (monster_is_camouflaged(mon)) {
			/*
			 * Become aware if the player can see the grid with
			 * the camouflaged monster before or after the swap.
			 */
			if (monster_is_in_view(mon) ||
				(m2 >= 0 && los(cave, pgrid, grid2)) ||
				(m2 < 0 && los(cave, grid1, grid2))) {
				become_aware(cave, mon);
			} else if (monster_is_mimicking(mon)) {
				move_mimicked_object(cave, mon, grid1, grid2);
				player->upkeep->redraw |= (PR_ITEMLIST);
			}
		}
		mon->grid = grid2;
		update_mon(mon, cave, true);

		/* Affect light? */
		if (mon->race->light != 0)
			player->upkeep->update |= PU_UPDATE_VIEW | PU_MONSTERS;

		/* Redraw monster list */
		player->upkeep->redraw |= (PR_MONLIST);
	} else if (m1 < 0) {
		/* Player */
		player->grid = grid2;
		player_leaving(pgrid, player->grid);

		/* Update the trap detection status */
		player->upkeep->redraw |= (PR_DTRAP);

		/* Updates */
		player->upkeep->update |= (PU_PANEL | PU_UPDATE_VIEW | PU_DISTANCE);

		/* Redraw monster list */
		player->upkeep->redraw |= (PR_MONLIST);

		/* Don't allow command repeat if moved away from item used. */
		cmd_disable_repeat_floor_item();
	}

	/* Monster 2 */
	if (m2 > 0) {
		/* Monster */
		mon = cave_monster(cave, m2);

		/* Update monster */
		if (monster_is_camouflaged(mon)) {
			/*
			 * Become aware if the player can see the grid with
			 * the camouflaged monster before or after the swap.
			 */
			if (monster_is_in_view(mon) ||
				(m1 >= 0 && los(cave, pgrid, grid1)) ||
				(m1 < 0 && los(cave, grid2, grid1))) {
				become_aware(cave, mon);
			} else if (monster_is_mimicking(mon)) {
				move_mimicked_object(cave, mon, grid2, grid1);
				player->upkeep->redraw |= (PR_ITEMLIST);
			}
		}
		mon->grid = grid1;
		update_mon(mon, cave, true);

		/* Affect light? */
		if (mon->race->light != 0)
			player->upkeep->update |= PU_UPDATE_VIEW | PU_MONSTERS;

		/* Redraw monster list */
		player->upkeep->redraw |= (PR_MONLIST);
	} else if (m2 < 0) {
		/* Player */
		player->grid = grid1;
		player_leaving(pgrid, player->grid);

		/* Update the trap detection status */
		player->upkeep->redraw |= (PR_DTRAP);

		/* Updates */
		player->upkeep->update |= (PU_PANEL | PU_UPDATE_VIEW | PU_DISTANCE);

		/* Redraw monster list */
		player->upkeep->redraw |= (PR_MONLIST);

		/* Don't allow command repeat if moved away from item used. */
		cmd_disable_repeat_floor_item();
	}

	/* Redraw */
	square_light_spot(cave, grid1);
	square_light_spot(cave, grid2);
}